

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall
capnp::DynamicStruct::Builder::Builder(Builder *this,StructSchema schema,OrphanBuilder *orphan)

{
  StructSize size;
  StructSchema in_RAX;
  
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  size = anon_unknown_71::structSizeFromSchema(in_RAX);
  capnp::_::OrphanBuilder::asStruct(&this->builder,orphan,size);
  return;
}

Assistant:

DynamicStruct::Builder::Builder(StructSchema schema, _::OrphanBuilder& orphan)
    : schema(schema), builder(orphan.asStruct(structSizeFromSchema(schema))) {}